

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_hashutil.cpp
# Opt level: O3

void __thiscall
HashUtil_Sha256DBytePubkey_Test::~HashUtil_Sha256DBytePubkey_Test
          (HashUtil_Sha256DBytePubkey_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HashUtil, Sha256DBytePubkey) {
  Pubkey target(
      "032f061438c62aa9a1685d7451a4bf1af8d0b8c132b0db4614147df19b687c01db");
  ByteData256 byte_data = HashUtil::Sha256D(target);
  EXPECT_STREQ(
      byte_data.GetHex().c_str(),
      "80b32bdf77034a9b152bac4ce3f8755ba72217c297c03b6ed150b544f0f2948c");
}